

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

int __thiscall
tcmalloc::CentralFreeList::RemoveRange(CentralFreeList *this,void **start,void **end,int N)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *local_40;
  void *head;
  void *tail;
  
  SpinLock::Lock(&this->lock_);
  if (((&DAT_0012e844)[(uint)this->size_class_] == N) && (0 < this->used_slots_)) {
    uVar1 = this->used_slots_ - 1;
    this->used_slots_ = uVar1;
    *start = this->tc_slots_[uVar1].head;
    *end = this->tc_slots_[uVar1].tail;
    iVar2 = N;
  }
  else {
    *start = (void *)0x0;
    *end = (void *)0x0;
    iVar2 = FetchFromOneSpansSafe(this,N,start,end);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      for (; N - iVar2 != 0 && iVar2 <= N; iVar2 = iVar2 + iVar3) {
        local_40 = (void *)0x0;
        head = (void *)0x0;
        iVar3 = FetchFromOneSpans(this,N - iVar2,&local_40,&head);
        if (iVar3 == 0) break;
        if (local_40 != (void *)0x0) {
          *(void **)head = *start;
          *start = local_40;
        }
      }
    }
  }
  SpinLock::Unlock(&this->lock_);
  return iVar2;
}

Assistant:

int CentralFreeList::RemoveRange(void **start, void **end, int N) {
  ASSERT(N > 0);
  lock_.Lock();
  if (N == Static::sizemap()->num_objects_to_move(size_class_) &&
      used_slots_ > 0) {
    int slot = --used_slots_;
    ASSERT(slot >= 0);
    TCEntry *entry = &tc_slots_[slot];
    *start = entry->head;
    *end = entry->tail;
    lock_.Unlock();
    return N;
  }

  int result = 0;
  *start = nullptr;
  *end = nullptr;
  // TODO: Prefetch multiple TCEntries?
  result = FetchFromOneSpansSafe(N, start, end);
  if (result != 0) {
    while (result < N) {
      int n;
      void* head = nullptr;
      void* tail = nullptr;
      n = FetchFromOneSpans(N - result, &head, &tail);
      if (!n) break;
      result += n;
      SLL_PushRange(start, head, tail);
    }
  }
  lock_.Unlock();
  return result;
}